

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseLocalFunction(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  ParseException *in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  ParserImpl *in_stack_00000008;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> body;
  TokenDetail name;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff68;
  ParserImpl *in_stack_ffffffffffffff70;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_00;
  LocalFunctionStatement *in_stack_ffffffffffffff80;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  TokenDetail *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  ParseException *this_01;
  
  this_01 = in_RSI;
  NextToken(in_stack_ffffffffffffff70);
  if (*(int *)&in_RSI[1].super_Exception != 0x108) {
    __assert_fail("current_.token_ == Token_Function",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x210,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseLocalFunction()"
                 );
  }
  pTVar1 = NextToken(in_stack_ffffffffffffff70);
  if (pTVar1->token_ != 0x115) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (this_01,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  local_48 = *(undefined8 *)&(in_RSI->super_Exception).field_0x8;
  uStack_40 = *(undefined8 *)&(in_RSI->super_Exception).field_0x10;
  local_38 = *(undefined8 *)&(in_RSI->super_Exception).field_0x18;
  uStack_30 = *(undefined8 *)&in_RSI[1].super_Exception;
  ParseFunctionBody(in_stack_00000008);
  pTVar1 = (TokenDetail *)operator_new(0x30);
  this_00 = local_58;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            (this_00,in_stack_ffffffffffffff68);
  luna::LocalFunctionStatement::LocalFunctionStatement(in_stack_ffffffffffffff80,pTVar1,this_00);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>(this_00,(pointer)in_stack_ffffffffffffff68)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff80);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff80);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseLocalFunction()
        {
            NextToken();                // skip 'function'
            assert(current_.token_ == Token_Function);

            if (NextToken().token_ != Token_Id)
                throw ParseException("expect 'id' after 'local function'", current_);

            TokenDetail name = current_;
            std::unique_ptr<SyntaxTree> body = ParseFunctionBody();

            return std::unique_ptr<SyntaxTree>(new LocalFunctionStatement(name, std::move(body)));
        }